

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::TypeInfo::TypeInfo(TypeInfo *this,TypeInfo *other)

{
  TypeInfo *other_local;
  TypeInfo *this_local;
  
  this->isTemp = false;
  this->kind = other->kind;
  if (this->kind == TupleKind) {
    Tuple::Tuple(&(this->field_2).tuple,&(other->field_2).tuple);
  }
  else {
    if (this->kind != RefKind) {
      handle_unreachable("unexpected kind",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x231);
    }
    (this->field_2).tuple.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start =
         (other->field_2).tuple.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->field_2).tuple.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (other->field_2).tuple.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

TypeInfo::TypeInfo(const TypeInfo& other) {
  kind = other.kind;
  switch (kind) {
    case TupleKind:
      new (&tuple) auto(other.tuple);
      return;
    case RefKind:
      new (&ref) auto(other.ref);
      return;
  }
  WASM_UNREACHABLE("unexpected kind");
}